

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O3

void __thiscall QToolBar::setToolButtonStyle(QToolBar *this,ToolButtonStyle toolButtonStyle)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(undefined1 *)(lVar1 + 0x255) = 1;
  if (*(ToolButtonStyle *)(lVar1 + 0x260) != toolButtonStyle) {
    *(ToolButtonStyle *)(lVar1 + 0x260) = toolButtonStyle;
    QWidget::setMinimumSize(&this->super_QWidget,0,0);
    local_2c = *(undefined4 *)(lVar1 + 0x260);
    local_20 = &local_2c;
    local_28 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,5,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::setToolButtonStyle(Qt::ToolButtonStyle toolButtonStyle)
{
    Q_D(QToolBar);
    d->explicitToolButtonStyle = true;
    if (d->toolButtonStyle == toolButtonStyle)
        return;
    d->toolButtonStyle = toolButtonStyle;
    setMinimumSize(0, 0);
    emit toolButtonStyleChanged(d->toolButtonStyle);
}